

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::EndColumns(void)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  ImGuiColumns *pIVar3;
  ImGuiColumnData *pIVar4;
  ImGuiCol idx;
  ImVec2 IVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  ImU32 col;
  ulong uVar8;
  ImGuiID id;
  int column_index;
  ulong uVar9;
  ImGuiContext *g;
  long lVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  undefined4 extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  bool held;
  bool hovered;
  ImRect column_hit_rect;
  bool local_ae;
  bool local_ad;
  uint local_ac;
  undefined1 local_a8 [16];
  ulong local_98;
  float local_8c;
  ImVec2 local_88;
  ImVec2 local_80;
  ImRect local_78;
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ImGuiContext *local_50;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pIVar6 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  pIVar3 = (pIVar2->DC).CurrentColumns;
  if (pIVar3 == (ImGuiColumns *)0x0) {
    __assert_fail("columns != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                  ,0x1d01,"void ImGui::EndColumns()");
  }
  PopItemWidth();
  if (1 < pIVar3->Count) {
    PopClipRect();
    ImDrawListSplitter::Merge(&pIVar2->DrawList->_Splitter,pIVar2->DrawList);
  }
  local_ac = pIVar3->Flags;
  fVar12 = (pIVar2->DC).CursorPos.y;
  uVar11 = -(uint)(fVar12 <= pIVar3->LineMaxY);
  local_68 = (float)(~uVar11 & (uint)fVar12 | (uint)pIVar3->LineMaxY & uVar11);
  pIVar3->LineMaxY = local_68;
  uStack_64 = 0;
  uStack_60 = 0;
  uStack_5c = 0;
  (pIVar2->DC).CursorPos.y = local_68;
  if ((local_ac & 0x10) == 0) {
    (pIVar2->DC).CursorMaxPos.x = pIVar3->HostCursorMaxPosX;
  }
  if (((local_ac & 1) == 0) && (pIVar2->SkipItems == false)) {
    uVar11 = pIVar3->Count;
    column_index = -1;
    if (1 < (int)uVar11) {
      local_50 = pIVar6;
      fVar12 = (pIVar2->ClipRect).Min.y;
      uVar11 = -(uint)(fVar12 <= pIVar3->HostCursorPosY);
      local_48 = (float)(~uVar11 & (uint)fVar12 | (uint)pIVar3->HostCursorPosY & uVar11);
      fVar12 = (pIVar2->ClipRect).Max.y;
      if (fVar12 <= local_68) {
        local_68 = fVar12;
      }
      uStack_64 = 0;
      uStack_60 = 0;
      uStack_5c = 0;
      uStack_44 = 0;
      uStack_40 = 0;
      uStack_3c = 0;
      local_8c = local_48 + 1.0;
      local_98 = 0xffffffff;
      uVar9 = 1;
      lVar10 = 0x24;
      do {
        if ((long)(pIVar3->Columns).Size <= (long)uVar9) goto LAB_00186453;
        pIVar4 = (pIVar3->Columns).Data;
        local_a8._0_4_ = (pIVar2->Pos).x;
        fVar12 = GetColumnOffset((int)uVar9);
        local_a8._0_4_ = fVar12 + (float)local_a8._0_4_;
        id = pIVar3->ID + (int)uVar9;
        local_78.Min.x = (float)local_a8._0_4_ + -4.0;
        local_a8._4_4_ = extraout_XMM0_Db;
        local_a8._8_4_ = extraout_XMM0_Dc;
        local_a8._12_4_ = extraout_XMM0_Dd;
        local_78.Max.x = (float)local_a8._0_4_ + 4.0;
        local_78.Min.y = local_48;
        local_78.Max.y = local_68;
        KeepAliveID(id);
        bVar7 = IsClippedEx(&local_78,id,false);
        if (!bVar7) {
          local_ad = false;
          local_ae = false;
          if ((local_ac & 2) == 0) {
            ButtonBehavior(&local_78,id,&local_ad,&local_ae,0);
            if ((local_ad != false) || (local_ae == true)) {
              local_50->MouseCursor = 4;
            }
            if (local_ae == true) {
              if ((*(byte *)((long)&pIVar4->OffsetNorm + lVar10) & 2) == 0) {
                local_98 = uVar9;
              }
              local_98 = local_98 & 0xffffffff;
            }
          }
          idx = (local_ad & 1) + 0x1b;
          if (local_ae != false) {
            idx = 0x1d;
          }
          col = GetColorU32(idx,1.0);
          local_88.x = (float)(int)(float)local_a8._0_4_;
          local_80.y = local_8c;
          local_88.y = local_68;
          local_80.x = local_88.x;
          ImDrawList::AddLine(pIVar2->DrawList,&local_80,&local_88,col,1.0);
        }
        uVar9 = uVar9 + 1;
        uVar11 = pIVar3->Count;
        lVar10 = lVar10 + 0x1c;
      } while ((long)uVar9 < (long)(int)uVar11);
      column_index = (int)local_98;
    }
    if (column_index != -1) {
      if ((-1 < (int)uVar11) && (pIVar3->IsBeingResized == false)) {
        uVar1 = (pIVar3->Columns).Size;
        uVar8 = 0;
        uVar9 = (ulong)uVar1;
        if ((int)uVar1 < 1) {
          uVar9 = uVar8;
        }
        do {
          if (uVar9 * 0x1c == uVar8) {
LAB_00186453:
            __assert_fail("i < Size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.h"
                          ,0x4d8,
                          "T &ImVector<ImGuiColumnData>::operator[](int) [T = ImGuiColumnData]");
          }
          pIVar4 = (pIVar3->Columns).Data;
          *(undefined4 *)((long)&pIVar4->OffsetNormBeforeResize + uVar8) =
               *(undefined4 *)((long)&pIVar4->OffsetNorm + uVar8);
          uVar8 = uVar8 + 0x1c;
        } while ((ulong)uVar11 * 0x1c + 0x1c != uVar8);
      }
      pIVar3->IsBeingResized = true;
      pIVar6 = GImGui;
      if (column_index < 1) {
        __assert_fail("column_index > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                      ,0x1bea,"float GetDraggedColumnOffset(ImGuiColumns *, int)");
      }
      if (GImGui->ActiveId != pIVar3->ID + column_index) {
        __assert_fail("g.ActiveId == columns->ID + ImGuiID(column_index)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                      ,0x1beb,"float GetDraggedColumnOffset(ImGuiColumns *, int)");
      }
      local_a8 = ZEXT416((uint)((((GImGui->IO).MousePos.x - (GImGui->ActiveIdClickOffset).x) + 4.0)
                               - (GImGui->CurrentWindow->Pos).x));
      fVar12 = GetColumnOffset(column_index + -1);
      fVar12 = fVar12 + (pIVar6->Style).ColumnsMinSpacing;
      uVar11 = -(uint)(fVar12 <= (float)local_a8._0_4_);
      fVar12 = (float)(~uVar11 & (uint)fVar12 | local_a8._0_4_ & uVar11);
      if ((pIVar3->Flags & 4) != 0) {
        local_a8._4_4_ = local_a8._4_4_ & extraout_XMM0_Db_00;
        local_a8._0_4_ = fVar12;
        local_a8._8_4_ = local_a8._8_4_ & extraout_XMM0_Dc_00;
        local_a8._12_4_ = local_a8._12_4_ & extraout_XMM0_Dd_00;
        fVar13 = GetColumnOffset(column_index + 1);
        fVar13 = fVar13 - (pIVar6->Style).ColumnsMinSpacing;
        fVar12 = (float)local_a8._0_4_;
        if (fVar13 <= (float)local_a8._0_4_) {
          fVar12 = fVar13;
        }
      }
      SetColumnOffset(column_index,fVar12);
    }
    bVar7 = column_index != -1;
  }
  else {
    bVar7 = false;
  }
  pIVar3->IsBeingResized = bVar7;
  IVar5 = (pIVar3->HostWorkRect).Max;
  (pIVar2->WorkRect).Min = (pIVar3->HostWorkRect).Min;
  (pIVar2->WorkRect).Max = IVar5;
  (pIVar2->DC).CurrentColumns = (ImGuiColumns *)0x0;
  (pIVar2->DC).ColumnsOffset.x = 0.0;
  (pIVar2->DC).CursorPos.x = (float)(int)((pIVar2->Pos).x + (pIVar2->DC).Indent.x + 0.0);
  return;
}

Assistant:

void ImGui::EndColumns()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImGuiColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    PopItemWidth();
    if (columns->Count > 1)
    {
        PopClipRect();
        window->DrawList->ChannelsMerge();
    }

    const ImGuiColumnsFlags flags = columns->Flags;
    columns->LineMaxY = ImMax(columns->LineMaxY, window->DC.CursorPos.y);
    window->DC.CursorPos.y = columns->LineMaxY;
    if (!(flags & ImGuiColumnsFlags_GrowParentContentsSize))
        window->DC.CursorMaxPos.x = columns->HostCursorMaxPosX;  // Restore cursor max pos, as columns don't grow parent

    // Draw columns borders and handle resize
    // The IsBeingResized flag ensure we preserve pre-resize columns width so back-and-forth are not lossy
    bool is_being_resized = false;
    if (!(flags & ImGuiColumnsFlags_NoBorder) && !window->SkipItems)
    {
        // We clip Y boundaries CPU side because very long triangles are mishandled by some GPU drivers.
        const float y1 = ImMax(columns->HostCursorPosY, window->ClipRect.Min.y);
        const float y2 = ImMin(window->DC.CursorPos.y, window->ClipRect.Max.y);
        int dragging_column = -1;
        for (int n = 1; n < columns->Count; n++)
        {
            ImGuiColumnData* column = &columns->Columns[n];
            float x = window->Pos.x + GetColumnOffset(n);
            const ImGuiID column_id = columns->ID + ImGuiID(n);
            const float column_hit_hw = COLUMNS_HIT_RECT_HALF_WIDTH;
            const ImRect column_hit_rect(ImVec2(x - column_hit_hw, y1), ImVec2(x + column_hit_hw, y2));
            KeepAliveID(column_id);
            if (IsClippedEx(column_hit_rect, column_id, false))
                continue;

            bool hovered = false, held = false;
            if (!(flags & ImGuiColumnsFlags_NoResize))
            {
                ButtonBehavior(column_hit_rect, column_id, &hovered, &held);
                if (hovered || held)
                    g.MouseCursor = ImGuiMouseCursor_ResizeEW;
                if (held && !(column->Flags & ImGuiColumnsFlags_NoResize))
                    dragging_column = n;
            }

            // Draw column
            const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
            const float xi = (float)(int)x;
            window->DrawList->AddLine(ImVec2(xi, y1 + 1.0f), ImVec2(xi, y2), col);
        }

        // Apply dragging after drawing the column lines, so our rendered lines are in sync with how items were displayed during the frame.
        if (dragging_column != -1)
        {
            if (!columns->IsBeingResized)
                for (int n = 0; n < columns->Count + 1; n++)
                    columns->Columns[n].OffsetNormBeforeResize = columns->Columns[n].OffsetNorm;
            columns->IsBeingResized = is_being_resized = true;
            float x = GetDraggedColumnOffset(columns, dragging_column);
            SetColumnOffset(dragging_column, x);
        }
    }
    columns->IsBeingResized = is_being_resized;

    window->WorkRect = columns->HostWorkRect;
    window->DC.CurrentColumns = NULL;
    window->DC.ColumnsOffset.x = 0.0f;
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
}